

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

bool boost::filesystem::detail::is_empty(path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  value_type *__file;
  bool local_b1;
  undefined1 local_b0 [8];
  stat path_stat;
  error_code *ec_local;
  path *p_local;
  
  path_stat.__glibc_reserved[2] = (__syscall_slong_t)ec;
  __file = filesystem::path::c_str(p);
  iVar2 = stat64(__file,(stat64 *)local_b0);
  bVar1 = anon_unknown.dwarf_522f::error
                    ((uint)(iVar2 != 0),p,(error_code *)path_stat.__glibc_reserved[2],
                     "boost::filesystem::is_empty");
  if (bVar1) {
    p_local._7_1_ = false;
  }
  else {
    if (((uint)path_stat.st_nlink & 0xf000) == 0x4000) {
      local_b1 = anon_unknown.dwarf_522f::is_empty_directory(p);
    }
    else {
      local_b1 = path_stat.st_rdev == 0;
    }
    p_local._7_1_ = local_b1;
  }
  return p_local._7_1_;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool is_empty(const path& p, system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (error(::stat(p.c_str(), &path_stat)!= 0,
        p, ec, "boost::filesystem::is_empty"))
      return false;        
    return S_ISDIR(path_stat.st_mode)
      ? is_empty_directory(p)
      : path_stat.st_size == 0;
#   else

    WIN32_FILE_ATTRIBUTE_DATA fad;
    if (error(::GetFileAttributesExW(p.c_str(), ::GetFileExInfoStandard, &fad)== 0
      ? BOOST_ERRNO : 0, p, ec, "boost::filesystem::is_empty"))
        return false;

    if (ec != 0) ec->clear();
    return 
      (fad.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY)
        ? is_empty_directory(p)
        : (!fad.nFileSizeHigh && !fad.nFileSizeLow);
#   endif
  }